

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
          (timestamp_t input)

{
  bool bVar1;
  timestamp_t tVar2;
  undefined1 auVar3 [16];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input);
  tVar2.value = input.value;
  if ((!bVar1) &&
     (bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_40,false),
     tVar2.value = local_40.value, !bVar1)) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
              (&local_38,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,&local_38);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}